

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

void __thiscall ON_PANOSE1::Dump(ON_PANOSE1 *this,ON_TextLog *text_log)

{
  ON_wString this_00;
  bool bVar1;
  wchar_t *pwVar2;
  ON_wString local_50 [3];
  ON_wString local_38;
  ON_wString family;
  ON_TextLog *text_log_local;
  ON_PANOSE1 *this_local;
  
  family.m_s = (wchar_t *)text_log;
  bVar1 = IsZero(this);
  if (bVar1) {
    ON_TextLog::Print((ON_TextLog *)family.m_s,L"PANOSE1::Zero\n");
  }
  else {
    pwVar2 = FamilyKindToWideString(this->m_family_kind);
    ON_wString::ON_wString(&local_38,pwVar2);
    bVar1 = ON_wString::IsEmpty(&local_38);
    if (bVar1) {
      ON_wString::FormatToString((wchar_t *)local_50,L"%u",(ulong)this->m_family_kind);
      ON_wString::operator=(&local_38,local_50);
      ON_wString::~ON_wString(local_50);
    }
    this_00.m_s = family.m_s;
    pwVar2 = ON_wString::operator_cast_to_wchar_t_(&local_38);
    ON_TextLog::Print((ON_TextLog *)this_00.m_s,
                      L"PANOSE1: %ls (%u, %u, %u, %u, %u, %u, %u, %u, %u)\n",pwVar2,
                      (ulong)this->m_prop1,(ulong)this->m_prop2,(ulong)this->m_prop3,
                      (uint)this->m_prop4,(uint)this->m_prop5,(uint)this->m_prop6,
                      (uint)this->m_prop7,(uint)this->m_prop8,(uint)this->m_prop9);
    ON_wString::~ON_wString(&local_38);
  }
  return;
}

Assistant:

void ON_PANOSE1::Dump(
  class ON_TextLog& text_log
) const
{
  if (IsZero())
  {
    text_log.Print(L"PANOSE1::Zero\n");
  }
  else
  {
    ON_wString family = FamilyKindToWideString(m_family_kind);
    if (family.IsEmpty())
      family = ON_wString::FormatToString(L"%u", (unsigned int)m_family_kind);
    text_log.Print(L"PANOSE1: %ls (%u, %u, %u, %u, %u, %u, %u, %u, %u)\n",
      static_cast<const wchar_t*>(family),
      (unsigned int)m_prop1,
      (unsigned int)m_prop2,
      (unsigned int)m_prop3,
      (unsigned int)m_prop4,
      (unsigned int)m_prop5,
      (unsigned int)m_prop6,
      (unsigned int)m_prop7,
      (unsigned int)m_prop8,
      (unsigned int)m_prop9
    );
  }
}